

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O1

void __thiscall pg::TLQSolver::~TLQSolver(TLQSolver *this)

{
  ~TLQSolver(this);
  operator_delete(this,0x220);
  return;
}

Assistant:

TLQSolver::~TLQSolver()
{
}